

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::RandomFragmentOpCase::iterate(RandomFragmentOpCase *this)

{
  TextureFormat TVar1;
  TextureFormat TVar2;
  Vec4 *pVVar3;
  CallLogWrapper *this_00;
  TextureLevel *pTVar4;
  TextureFormat TVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  TestLog *pTVar9;
  QuadRenderer *this_01;
  code *pcVar10;
  ReferenceQuadRenderer *this_02;
  RenderContext *context;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  deUint32 dVar15;
  GLenum GVar16;
  undefined4 extraout_var;
  RenderTarget *pRVar18;
  TextureFormat *pTVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  deUint32 glFace;
  bool bVar23;
  char *pcVar24;
  pointer pcVar25;
  TextureLevel *pTVar26;
  int iVar27;
  void *pvVar28;
  pointer pRVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  Surface referenceImg;
  Surface renderedImg;
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  commands;
  UVec4 threshold;
  Vec4 clearColor;
  ScopedLogSection iterSection;
  Random rnd;
  FragmentOperationState refState;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  Surface local_300;
  Surface local_2e8;
  int local_2cc;
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  local_2c8;
  undefined1 local_2a8 [40];
  undefined1 local_280 [16];
  pointer local_270 [3];
  undefined1 local_258 [12];
  GLfloat GStack_24c;
  ScopedLogSection local_248;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  undefined1 local_218 [16];
  TextureLevel *local_208 [3];
  undefined1 local_1f0 [40];
  deRandom local_1c8;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8 [2];
  undefined1 auStack_1a0 [16];
  float afStack_190 [2];
  float local_188 [4];
  float local_178 [2];
  float afStack_170 [2];
  float local_168 [4];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138 [66];
  long lVar17;
  
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar17 = CONCAT44(extraout_var,iVar12);
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_2cc = pRVar18->m_numSamples;
  uVar14 = (this->m_seed >> 0x10 ^ this->m_seed ^ 0x3d) * 9;
  uVar21 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar13 = tcu::CommandLine::getBaseSeed
                     (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  uVar13 = (uVar13 >> 0x10 ^ uVar13 ^ 0x3d) * 9;
  uVar14 = (uVar13 >> 4 ^ uVar13) * 0x27d4eb2d ^
           (uVar21 >> 4 ^ uVar21) * 0x27d4eb2d ^ (uVar14 >> 4 ^ uVar14) * 0x27d4eb2d;
  deRandom_init(&local_1c8,uVar14 >> 0xf ^ uVar14);
  iVar12 = (this->m_refColorBuffer->m_size).m_data[0];
  iVar31 = (this->m_refColorBuffer->m_size).m_data[1];
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar30 = pRVar18->m_width;
  dVar15 = deRandom_getUint32(&local_1c8);
  uVar14 = dVar15 % ((iVar30 - iVar12) + 1U);
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar30 = pRVar18->m_height;
  dVar15 = deRandom_getUint32(&local_1c8);
  uVar21 = dVar15 % ((iVar30 - iVar31) + 1U);
  tcu::Surface::Surface(&local_2e8,iVar12,iVar31);
  tcu::Surface::Surface(&local_300,iVar12,iVar31);
  local_258._0_8_ = 0x3f0000003e800000;
  stack0xfffffffffffffdb0 = (pointer)0x3f8000003f400000;
  pTVar9 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  TVar5 = (TextureFormat)((long)local_2a8 + 0x10);
  local_2a8._0_8_ = TVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Iteration","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)&local_148);
  pcVar25 = (pointer)0xf;
  if ((TextureFormat)local_2a8._0_8_ != TVar5) {
    pcVar25 = (pointer)local_2a8._16_8_;
  }
  if (pcVar25 < (pointer)(local_280._8_8_ + CONCAT44(local_2a8._12_4_,local_2a8._8_4_))) {
    pcVar25 = (pointer)0xf;
    if ((pointer *)local_280._0_8_ != local_270) {
      pcVar25 = local_270[0];
    }
    if (pcVar25 < (pointer)(local_280._8_8_ + CONCAT44(local_2a8._12_4_,local_2a8._8_4_)))
    goto LAB_0118dcb3;
    pTVar19 = (TextureFormat *)
              std::__cxx11::string::replace((ulong)local_280,0,(char *)0x0,local_2a8._0_8_);
  }
  else {
LAB_0118dcb3:
    pTVar19 = (TextureFormat *)std::__cxx11::string::_M_append(local_2a8,local_280._0_8_);
  }
  local_328._0_8_ = &local_318;
  TVar1 = (TextureFormat)(pTVar19 + 2);
  if (*pTVar19 == TVar1) {
    local_318._M_allocated_capacity = *(undefined8 *)TVar1;
    local_318._8_8_ = pTVar19[3];
  }
  else {
    local_318._M_allocated_capacity = *(undefined8 *)TVar1;
    local_328._0_8_ = *pTVar19;
  }
  local_328._8_8_ = pTVar19[1];
  *pTVar19 = TVar1;
  pTVar19[1].order = R;
  pTVar19[1].type = SNORM_INT8;
  *(char *)TVar1 = '\0';
  TVar1 = (TextureFormat)((long)local_1f0 + 0x10);
  local_1f0._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"Iteration ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)&local_148);
  pTVar4 = (TextureLevel *)((long)(RenderContext **)local_218._8_8_ + local_1f0._8_8_);
  pTVar26 = (TextureLevel *)0xf;
  if ((TextureFormat)local_1f0._0_8_ != TVar1) {
    pTVar26 = (TextureLevel *)local_1f0._16_8_;
  }
  if (pTVar26 < pTVar4) {
    pTVar26 = (TextureLevel *)0xf;
    if ((TextureLevel **)local_218._0_8_ != local_208) {
      pTVar26 = local_208[0];
    }
    if (pTVar4 <= pTVar26) {
      pTVar19 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,local_1f0._0_8_);
      goto LAB_0118de16;
    }
  }
  pTVar19 = (TextureFormat *)std::__cxx11::string::_M_append(local_1f0,local_218._0_8_);
LAB_0118de16:
  local_240._0_8_ = &local_230;
  TVar2 = (TextureFormat)(pTVar19 + 2);
  if (*pTVar19 == TVar2) {
    local_230._M_allocated_capacity = *(undefined8 *)TVar2;
    local_230._8_8_ = pTVar19[3];
  }
  else {
    local_230._M_allocated_capacity = *(undefined8 *)TVar2;
    local_240._0_8_ = *pTVar19;
  }
  local_240._8_8_ = pTVar19[1];
  *pTVar19 = TVar2;
  pTVar19[1].order = R;
  pTVar19[1].type = SNORM_INT8;
  *(char *)TVar2 = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&local_248,pTVar9,(string *)local_328,(string *)local_240)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._0_8_ != &local_230) {
    operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
  }
  if ((TextureLevel **)local_218._0_8_ != local_208) {
    operator_delete((void *)local_218._0_8_,(ulong)((long)&(local_208[0]->m_format).order + 1));
  }
  if ((TextureFormat)local_1f0._0_8_ != TVar1) {
    operator_delete((void *)local_1f0._0_8_,
                    (ulong)((long)&((TextureFormat *)local_1f0._16_8_)->order + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._0_8_ != &local_318) {
    operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
  }
  if ((pointer *)local_280._0_8_ != local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270[0] + 1));
  }
  if ((TextureFormat)local_2a8._0_8_ != TVar5) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
  }
  local_2c8.
  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::InteractionTestUtil::computeRandomRenderCommands
            ((Random *)&local_1c8,(ApiType)0x3,3,iVar12,iVar31,&local_2c8);
  (**(code **)(lVar17 + 0x4e8))(0xc11);
  (**(code **)(lVar17 + 0x238))(1,1,1,1);
  (**(code **)(lVar17 + 0x4a8))(1);
  (**(code **)(lVar17 + 0x12d8))(0xffffffff);
  this_00 = &this->m_callLogWrapper;
  glu::CallLogWrapper::glClearColor
            (this_00,(GLfloat)local_258._0_4_,(GLfloat)local_258._4_4_,(GLfloat)local_258._8_4_,
             GStack_24c);
  glu::CallLogWrapper::glClearDepthf(this_00,1.0);
  glu::CallLogWrapper::glClearStencil(this_00,0);
  glu::CallLogWrapper::glClear(this_00,0x4500);
  glu::CallLogWrapper::glViewport(this_00,uVar14,uVar21,iVar12,iVar31);
  for (pRVar29 = local_2c8.
                 super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pRVar29 !=
      local_2c8.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish; pRVar29 = pRVar29 + 1) {
    if ((pRVar29->state).scissorTestEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xc11);
      glu::CallLogWrapper::glScissor
                (this_00,(pRVar29->state).scissorRectangle.left + uVar14,
                 (pRVar29->state).scissorRectangle.bottom + uVar21,
                 (pRVar29->state).scissorRectangle.width,(pRVar29->state).scissorRectangle.height);
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xc11);
    }
    if ((pRVar29->state).stencilTestEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xb90);
      GVar16 = 0x404;
      lVar20 = 0;
      bVar11 = true;
      do {
        bVar23 = bVar11;
        glu::CallLogWrapper::glStencilFuncSeparate
                  (this_00,GVar16,(pRVar29->state).stencil[lVar20].function,
                   (pRVar29->state).stencil[lVar20].reference,
                   (pRVar29->state).stencil[lVar20].compareMask);
        glu::CallLogWrapper::glStencilOpSeparate
                  (this_00,GVar16,(pRVar29->state).stencil[lVar20].stencilFailOp,
                   (pRVar29->state).stencil[lVar20].depthFailOp,
                   (pRVar29->state).stencil[lVar20].depthPassOp);
        glu::CallLogWrapper::glStencilMaskSeparate
                  (this_00,GVar16,(pRVar29->state).stencil[lVar20].writeMask);
        lVar20 = 1;
        GVar16 = 0x405;
        bVar11 = false;
      } while (bVar23);
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xb90);
    }
    if ((pRVar29->state).depthTestEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xb71);
      glu::CallLogWrapper::glDepthFunc(this_00,(pRVar29->state).depthFunc);
      glu::CallLogWrapper::glDepthMask(this_00,(pRVar29->state).depthWriteMask);
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xb71);
    }
    if ((pRVar29->state).blendEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xbe2);
      glu::CallLogWrapper::glBlendEquationSeparate
                (this_00,(pRVar29->state).blendRGBState.equation,
                 (pRVar29->state).blendAState.equation);
      glu::CallLogWrapper::glBlendFuncSeparate
                (this_00,(pRVar29->state).blendRGBState.srcFunc,
                 (pRVar29->state).blendRGBState.dstFunc,(pRVar29->state).blendAState.srcFunc,
                 (pRVar29->state).blendAState.dstFunc);
      glu::CallLogWrapper::glBlendColor
                (this_00,(pRVar29->state).blendColor.m_data[0],(pRVar29->state).blendColor.m_data[1]
                 ,(pRVar29->state).blendColor.m_data[2],(pRVar29->state).blendColor.m_data[3]);
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xbe2);
    }
    if ((pRVar29->state).ditherEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xbd0);
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xbd0);
    }
    glu::CallLogWrapper::glColorMask
              (this_00,(pRVar29->state).colorMask.m_data[0],(pRVar29->state).colorMask.m_data[1],
               (pRVar29->state).colorMask.m_data[2],(pRVar29->state).colorMask.m_data[3]);
    local_1b8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,"// Quad: ",9);
    tcu::operator<<((ostream *)&fStack_1b0,(Vector<int,_2> *)pRVar29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0," -> ",4);
    tcu::operator<<((ostream *)&fStack_1b0,&(pRVar29->quad).posB);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", color: [",10);
    pVVar3 = (pRVar29->quad).color;
    tcu::operator<<((ostream *)&fStack_1b0,pVVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", ",2);
    tcu::operator<<((ostream *)&fStack_1b0,(pRVar29->quad).color + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", ",2);
    tcu::operator<<((ostream *)&fStack_1b0,(pRVar29->quad).color + 2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", ",2);
    tcu::operator<<((ostream *)&fStack_1b0,(pRVar29->quad).color + 3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", depth: [",10);
    std::ostream::_M_insert<double>((double)(pRVar29->quad).depth[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", ",2);
    std::ostream::_M_insert<double>((double)(pRVar29->quad).depth[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", ",2);
    std::ostream::_M_insert<double>((double)(pRVar29->quad).depth[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", ",2);
    std::ostream::_M_insert<double>((double)(pRVar29->quad).depth[3]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
    std::ios_base::~ios_base((ios_base *)&uStack_140);
    this_01 = this->m_renderer;
    pcVar10 = *(code **)(lVar17 + 0x1a00);
    local_138[4] = 0.0;
    local_138[5] = 0.0;
    local_138[6] = 0.0;
    local_138[7] = 0.0;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    local_138[3] = 0.0;
    local_148._0_4_ = 0.0;
    local_148._4_4_ = 0.0;
    uStack_140._0_4_ = 0.0;
    uStack_140._4_4_ = 0.0;
    local_158._0_4_ = BLENDEQUATION_ADD;
    local_158._4_4_ = BLENDFUNC_ZERO;
    local_158._8_4_ = 0.0;
    local_158._12_4_ = 0.0;
    local_168[0] = 0.0;
    local_168[1] = 0.0;
    local_168[2] = 0.0;
    local_168[3] = 0.0;
    local_1a8 = *(float (*) [2])pVVar3->m_data;
    auStack_1a0._0_4_ = (TestFunc)(pRVar29->quad).color[0].m_data[2];
    auStack_1a0._4_4_ = (int)(pRVar29->quad).color[0].m_data[3];
    auStack_1a0._8_8_ = *(undefined8 *)(pRVar29->quad).color[1].m_data;
    afStack_190 = *(float (*) [2])((pRVar29->quad).color[1].m_data + 2);
    local_188._0_8_ = *(undefined8 *)(pRVar29->quad).color[2].m_data;
    pVVar3 = (pRVar29->quad).color;
    local_188[2] = (int)pVVar3[2].m_data[2];
    local_188[3] = (deUint32)pVVar3[2].m_data[3];
    local_178 = *(float (*) [2])(pRVar29->quad).color[3].m_data;
    afStack_170 = *(float (*) [2])((pRVar29->quad).color[3].m_data + 2);
    uVar7 = *(undefined8 *)(pRVar29->quad).posB.m_data;
    uVar8 = *(undefined8 *)(pRVar29->quad).posA.m_data;
    iVar30 = (int)uVar7;
    iVar22 = (int)uVar8;
    iVar12 = (int)((ulong)uVar8 >> 0x20);
    uVar13 = -(uint)(iVar30 < iVar22);
    iVar31 = (int)((ulong)uVar7 >> 0x20);
    uVar32 = -(uint)(iVar31 < iVar12);
    fStack_1b0 = (float)(uVar13 & 0xbf800000 | ~uVar13 & 0x3f800000);
    fStack_1ac = (float)(uVar32 & 0xbf800000 | ~uVar32 & 0x3f800000);
    local_1b8._4_4_ = uVar32 & 0x3f800000 | ~uVar32 & 0xbf800000;
    local_1b8._0_4_ = uVar13 & 0x3f800000 | ~uVar13 & 0xbf800000;
    lVar20 = 0x24;
    do {
      fVar6 = (float)(pRVar29->quad).posA.m_data[lVar20];
      *(float *)(local_1b8 + lVar20 * 4) = fVar6 + fVar6 + -1.0;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x28);
    iVar27 = iVar22 - iVar30;
    if (iVar22 < iVar30) {
      iVar30 = iVar22;
    }
    iVar22 = iVar12 - iVar31;
    if (iVar12 < iVar31) {
      iVar31 = iVar12;
    }
    iVar12 = -iVar22;
    if (0 < iVar22) {
      iVar12 = iVar22;
    }
    iVar22 = -iVar27;
    if (0 < iVar27) {
      iVar22 = iVar27;
    }
    (*pcVar10)(iVar30 + uVar14,iVar31 + uVar21,iVar22 + 1,iVar12 + 1);
    deqp::gls::FragmentOpUtil::QuadRenderer::render(this_01,(Quad *)local_1b8);
  }
  GVar16 = glu::CallLogWrapper::glGetError(this_00);
  (**(code **)(lVar17 + 0x650))();
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b8,this->m_refColorBuffer);
  tcu::clear((PixelBufferAccess *)local_1b8,(Vec4 *)local_258);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b8,this->m_refDepthBuffer);
  tcu::clearDepth((PixelBufferAccess *)local_1b8,1.0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b8,this->m_refStencilBuffer);
  tcu::clearStencil((PixelBufferAccess *)local_1b8,0);
  if (local_2c8.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2c8.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar29 = local_2c8.
              super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)local_1b8);
      pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
      translateState(&pRVar29->state,(FragmentOperationState *)local_1b8,pRVar18);
      this_02 = this->m_refRenderer;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a8,this->m_refColorBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess
                ((PixelBufferAccess *)local_328,(PixelBufferAccess *)local_2a8);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_240,this->m_refDepthBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess
                ((PixelBufferAccess *)local_280,(PixelBufferAccess *)local_240);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_218,this->m_refStencilBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess
                ((PixelBufferAccess *)local_1f0,(PixelBufferAccess *)local_218);
      deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
                (this_02,(PixelBufferAccess *)local_328,(PixelBufferAccess *)local_280,
                 (PixelBufferAccess *)local_1f0,&pRVar29->quad,(FragmentOperationState *)local_1b8);
      pRVar29 = pRVar29 + 1;
    } while (pRVar29 !=
             local_2c8.
             super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_328._0_4_ = RGBA;
  local_328._4_4_ = UNORM_INT8;
  pvVar28 = (void *)local_300.m_pixels.m_cap;
  if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
    pvVar28 = local_300.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)local_328,local_300.m_width,
             local_300.m_height,1,pvVar28);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_328,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)local_1b8,(EVP_PKEY_CTX *)local_328);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_328._0_4_ = RGBA;
  local_328._4_4_ = UNORM_INT8;
  pvVar28 = (void *)local_2e8.m_pixels.m_cap;
  if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
    pvVar28 = local_2e8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)local_328,local_2e8.m_width,
             local_2e8.m_height,1,pvVar28);
  glu::readPixels(context,uVar14,uVar21,(PixelBufferAccess *)local_1b8);
  iVar12 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar12;
  getCompareThreshold((RandomFragmentOpCase *)local_2a8);
  pTVar9 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  if (local_2cc < 2) {
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
      local_300.m_pixels.m_cap = (size_t)local_300.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b8,(TextureFormat *)local_328,local_300.m_width,
               local_300.m_height,1,(void *)local_300.m_pixels.m_cap);
    local_280._0_4_ = RGBA;
    local_280._4_4_ = UNORM_INT8;
    if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
      local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_328,(TextureFormat *)local_280,local_2e8.m_width,
               local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
    bVar11 = tcu::intThresholdCompare
                       (pTVar9,"CompareResult","Image Comparison Result",
                        (ConstPixelBufferAccess *)local_1b8,(ConstPixelBufferAccess *)local_328,
                        (UVec4 *)local_2a8,COMPARE_LOG_RESULT);
  }
  else {
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
      local_300.m_pixels.m_cap = (size_t)local_300.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b8,(TextureFormat *)local_328,local_300.m_width,
               local_300.m_height,1,(void *)local_300.m_pixels.m_cap);
    local_280._0_4_ = RGBA;
    local_280._4_4_ = UNORM_INT8;
    if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
      local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_328,(TextureFormat *)local_280,local_2e8.m_width,
               local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
    bVar11 = tcu::bilinearCompare
                       (pTVar9,"CompareResult","Image Comparison Result",
                        (ConstPixelBufferAccess *)local_1b8,(ConstPixelBufferAccess *)local_328,
                        (RGBA)(local_2a8._4_4_ << 8 | local_2a8._0_4_ |
                              local_2a8._8_4_ << 0x10 | local_2a8._12_4_ << 0x18),COMPARE_LOG_RESULT
                       );
  }
  local_1b8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
  pcVar24 = "  FAILED!";
  if (bVar11 != false) {
    pcVar24 = "  Passed.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,pcVar24,9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
  std::ios_base::~ios_base((ios_base *)&uStack_140);
  if ((bVar11 & GVar16 == 0) == 0) {
    pcVar24 = "Image comparison failed";
    if (bVar11 != false) {
      pcVar24 = "GL error";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               pcVar24);
  }
  if (local_2c8.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.
                    super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.
                          super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.
                          super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::TestLog::endSection(local_248.m_log);
  tcu::Surface::~Surface(&local_300);
  tcu::Surface::~Surface(&local_2e8);
  return (uint)(byte)((iVar12 < 10 && GVar16 == 0) & bVar11);
}

Assistant:

RandomFragmentOpCase::IterateResult RandomFragmentOpCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				isMSAA			= m_context.getRenderTarget().getNumSamples() > 1;
	const deUint32			iterSeed		= deUint32Hash(m_seed) ^ deInt32Hash(m_iterNdx) ^ deInt32Hash(m_testCtx.getCommandLine().getBaseSeed());
	de::Random				rnd				(iterSeed);

	const int				width			= m_refColorBuffer->getWidth();
	const int				height			= m_refColorBuffer->getHeight();
	const int				viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
	const int				viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);

	tcu::Surface			renderedImg		(width, height);
	tcu::Surface			referenceImg	(width, height);

	const Vec4				clearColor		= CLEAR_COLOR;
	const float				clearDepth		= CLEAR_DEPTH;
	const int				clearStencil	= CLEAR_STENCIL;

	bool					gotError		= false;

	const tcu::ScopedLogSection	iterSection	(m_testCtx.getLog(), std::string("Iteration") + de::toString(m_iterNdx), std::string("Iteration ") + de::toString(m_iterNdx));

	// Compute randomized rendering commands.
	vector<RenderCommand> commands;
	computeRandomRenderCommands(rnd, glu::ApiType::es(3,0), NUM_CALLS_PER_ITERATION, width, height, commands);

	// Reset default fragment state.
	gl.disable(GL_SCISSOR_TEST);
	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	gl.depthMask(GL_TRUE);
	gl.stencilMask(~0u);

	// Render using GL.
	m_callLogWrapper.glClearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	m_callLogWrapper.glClearDepthf(clearDepth);
	m_callLogWrapper.glClearStencil(clearStencil);
	m_callLogWrapper.glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_callLogWrapper.glViewport(viewportX, viewportY, width, height);

	for (vector<RenderCommand>::const_iterator cmd = commands.begin(); cmd != commands.end(); cmd++)
	{
		setGLState(m_callLogWrapper, cmd->state, viewportX, viewportY);

		if (ENABLE_CALL_LOG)
			m_testCtx.getLog() << TestLog::Message << "// Quad: " << cmd->quad.posA << " -> " << cmd->quad.posB
												   << ", color: [" << cmd->quad.color[0] << ", " << cmd->quad.color[1] << ", " << cmd->quad.color[2] << ", " << cmd->quad.color[3] << "]"
												   << ", depth: [" << cmd->quad.depth[0] << ", " << cmd->quad.depth[1] << ", " << cmd->quad.depth[2] << ", " << cmd->quad.depth[3] << "]"
								<< TestLog::EndMessage;

		renderQuad(gl, *m_renderer, cmd->quad, viewportX, viewportY);
	}

	// Check error.
	if (m_callLogWrapper.glGetError() != GL_NO_ERROR)
		gotError = true;

	gl.flush();

	// Render reference while GPU is doing work.
	tcu::clear			(m_refColorBuffer->getAccess(),		clearColor);
	tcu::clearDepth		(m_refDepthBuffer->getAccess(),		clearDepth);
	tcu::clearStencil	(m_refStencilBuffer->getAccess(),	clearStencil);

	for (vector<RenderCommand>::const_iterator cmd = commands.begin(); cmd != commands.end(); cmd++)
	{
		rr::FragmentOperationState refState;
		translateState(cmd->state, refState, m_context.getRenderTarget());
		m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
							  cmd->quad, refState);
	}

	// Expand reference color buffer to RGBA8
	copy(referenceImg.getAccess(), m_refColorBuffer->getAccess());

	// Read rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	m_iterNdx += 1;

	// Compare to reference.
	const bool			isLastIter	= m_iterNdx >= NUM_ITERATIONS_PER_CASE;
	const tcu::UVec4	threshold	= getCompareThreshold();
	bool				compareOk;

	if (isMSAA)
	{
		// in MSAA cases, the sampling points could be anywhere in the pixel and we could
		// even have multiple samples that are combined in resolve. Allow arbitrary sample
		// positions by using bilinearCompare.
		compareOk = tcu::bilinearCompare(m_testCtx.getLog(),
										 "CompareResult",
										 "Image Comparison Result",
										 referenceImg.getAccess(),
										 renderedImg.getAccess(),
										 tcu::RGBA(threshold.x(), threshold.y(), threshold.z(), threshold.w()),
										 tcu::COMPARE_LOG_RESULT);
	}
	else
		compareOk = tcu::intThresholdCompare(m_testCtx.getLog(),
											 "CompareResult",
											 "Image Comparison Result",
											 referenceImg.getAccess(),
											 renderedImg.getAccess(),
											 threshold,
											 tcu::COMPARE_LOG_RESULT);

	m_testCtx.getLog() << TestLog::Message << (compareOk ? "  Passed." : "  FAILED!") << TestLog::EndMessage;

	if (!compareOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	else if (gotError)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL error");

	if (compareOk && !gotError && !isLastIter)
		return CONTINUE;
	else
		return STOP;
}